

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::
emplaceRealloc<std::filesystem::__cxx11::path>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,pointer pos,path *args)

{
  path *this_00;
  ulong uVar1;
  size_type sVar2;
  pointer ppVar3;
  path *ppVar4;
  path *ppVar5;
  path *ppVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x333333333333333 - uVar1 < uVar1) {
    uVar8 = 0x333333333333333;
  }
  lVar7 = (long)pos - (long)this->data_;
  ppVar4 = (path *)operator_new(uVar8 * 0x28);
  this_00 = (path *)((long)ppVar4 + lVar7);
  std::filesystem::__cxx11::path::path(this_00,args);
  ppVar6 = this->data_;
  sVar2 = this->len;
  ppVar5 = ppVar4;
  if (ppVar6 + sVar2 == pos) {
    if (sVar2 != 0) {
      lVar7 = sVar2 * 0x28;
      do {
        args = ppVar6;
        std::filesystem::__cxx11::path::path(ppVar5,ppVar6);
        ppVar6 = ppVar6 + 1;
        ppVar5 = ppVar5 + 1;
        lVar7 = lVar7 + -0x28;
      } while (lVar7 != 0);
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      args = ppVar6;
      std::filesystem::__cxx11::path::path(ppVar5,ppVar6);
      ppVar5 = ppVar5 + 1;
    }
    sVar2 = this->len;
    ppVar3 = this->data_;
    if (ppVar3 + sVar2 != pos) {
      ppVar6 = (path *)(lVar7 + (long)ppVar4);
      do {
        ppVar6 = ppVar6 + 1;
        args = pos;
        std::filesystem::__cxx11::path::path(ppVar6,pos);
        pos = pos + 1;
      } while (pos != ppVar3 + sVar2);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar8;
  this->data_ = ppVar4;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}